

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PODVector.H
# Opt level: O2

size_type __thiscall
amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::GetNewCapacity
          (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *this,size_type a_num_to_be_added)

{
  size_type sVar1;
  size_type sVar2;
  
  sVar1 = this->m_capacity;
  sVar2 = 2;
  if (sVar1 != 0) {
    sVar2 = sVar1;
  }
  for (; sVar2 < a_num_to_be_added + sVar1; sVar2 = sVar2 * 3 + 1 >> 1) {
  }
  return sVar2;
}

Assistant:

size_type capacity () const noexcept { return m_capacity; }